

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_regex.cc
# Opt level: O0

string * escape_char(string *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  char *pcVar6;
  undefined1 *puVar7;
  ulong in_RSI;
  string *in_RDI;
  int i;
  int j;
  char *buf;
  string *rval;
  allocator<char> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar8;
  int iVar9;
  int iVar10;
  
  lVar4 = std::__cxx11::string::length();
  pvVar5 = operator_new__(lVar4 * 2 + 1);
  iVar9 = 0;
  iVar10 = 0;
  while (iVar3 = iVar9, iVar1 = std::__cxx11::string::length(), iVar9 < iVar1) {
    pcVar6 = (char *)std::__cxx11::string::operator[](in_RSI);
    if (*pcVar6 == '\\') {
      iVar9 = iVar3 + 1;
      iVar2 = std::__cxx11::string::length();
      iVar1 = iVar10;
      if (iVar9 < iVar2) {
        iVar1 = iVar10 + 1;
        *(undefined1 *)((long)pvVar5 + (long)iVar10) = 0x5c;
        pcVar6 = (char *)std::__cxx11::string::operator[](in_RSI);
        if (*pcVar6 == '/') {
          iVar3 = iVar3 + 1;
          puVar7 = (undefined1 *)std::__cxx11::string::operator[](in_RSI);
          *(undefined1 *)((long)pvVar5 + (long)(iVar1 + -1)) = *puVar7;
        }
        else {
          pcVar6 = (char *)std::__cxx11::string::operator[](in_RSI);
          if (((*pcVar6 == '/') ||
              (pcVar6 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar6 == '\\')) ||
             (pcVar6 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar6 == '\"')) {
            iVar3 = iVar3 + 1;
            puVar7 = (undefined1 *)std::__cxx11::string::operator[](in_RSI);
            *(undefined1 *)((long)pvVar5 + (long)iVar1) = *puVar7;
          }
          else {
            *(undefined1 *)((long)pvVar5 + (long)iVar1) = 0x5c;
          }
          iVar1 = iVar1 + 1;
        }
      }
    }
    else {
      pcVar6 = (char *)std::__cxx11::string::operator[](in_RSI);
      if (*pcVar6 == '\"') {
        *(undefined1 *)((long)pvVar5 + (long)iVar10) = 0x5c;
        *(undefined1 *)((long)pvVar5 + (long)(iVar10 + 1)) = 0x22;
        iVar1 = iVar10 + 2;
      }
      else {
        puVar7 = (undefined1 *)std::__cxx11::string::operator[](in_RSI);
        *(undefined1 *)((long)pvVar5 + (long)iVar10) = *puVar7;
        iVar1 = iVar10 + 1;
      }
    }
    iVar10 = iVar1;
    iVar9 = iVar3 + 1;
  }
  iVar9 = iVar10 + 1;
  *(undefined1 *)((long)pvVar5 + (long)iVar10) = 0;
  uVar8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar9,iVar3),(char *)CONCAT17(uVar8,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffde);
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return in_RDI;
}

Assistant:

string escape_char(const string& s)
	{
	char* buf = new char[s.length() * 2 + 1];
	int j = 0;
	for ( int i = 0; i < (int)s.length(); ++i )
		{
		if ( s[i] == '\\' )
			{
			if ( i + 1 < (int)s.length() )
				{
				buf[j++] = '\\';
				if ( s[i + 1] == '/' )
					buf[j - 1] = s[++i];
				else if ( s[i + 1] == '/' || s[i + 1] == '\\' || s[i + 1] == '"' )
					buf[j++] = s[++i];
				else
					buf[j++] = '\\';
				}
			}
		else if ( s[i] == '"' )
			{
			buf[j++] = '\\';
			buf[j++] = '"';
			}
		else
			{
			buf[j++] = s[i];
			}
		}

	buf[j++] = '\0';

	string rval = buf;
	delete[] buf;
	return rval;
	}